

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workqueue.h
# Opt level: O0

void __thiscall rengine::WorkQueue::run(WorkQueue *this)

{
  bool bVar1;
  reference pvVar2;
  element_type *peVar3;
  element_type *peVar4;
  undefined1 local_38 [8];
  shared_ptr<rengine::WorkQueue::Job> job;
  unique_lock<std::mutex> locker;
  bool running;
  WorkQueue *this_local;
  
  locker._15_1_ = this->m_running & 1;
  do {
    if (locker._15_1_ == '\0') {
      return;
    }
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)
               &job.super___shared_ptr<rengine::WorkQueue::Job,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&this->m_mutex);
    bVar1 = std::__cxx11::
            list<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
            ::empty(&this->m_jobs);
    if (bVar1) {
      std::condition_variable::wait((unique_lock *)&this->m_condition);
    }
    std::shared_ptr<rengine::WorkQueue::Job>::shared_ptr
              ((shared_ptr<rengine::WorkQueue::Job> *)local_38);
    bVar1 = std::__cxx11::
            list<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
            ::empty(&this->m_jobs);
    if (!bVar1) {
      pvVar2 = std::__cxx11::
               list<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
               ::front(&this->m_jobs);
      std::shared_ptr<rengine::WorkQueue::Job>::operator=
                ((shared_ptr<rengine::WorkQueue::Job> *)local_38,pvVar2);
      std::__cxx11::
      list<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
      ::pop_front(&this->m_jobs);
    }
    locker._15_1_ = this->m_running & 1;
    std::unique_lock<std::mutex>::unlock
              ((unique_lock<std::mutex> *)
               &job.super___shared_ptr<rengine::WorkQueue::Job,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if ((locker._15_1_ != 0) &&
       (peVar3 = std::__shared_ptr<rengine::WorkQueue::Job,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<rengine::WorkQueue::Job,_(__gnu_cxx::_Lock_policy)2> *)
                            local_38), peVar3 != (element_type *)0x0)) {
      peVar4 = std::
               __shared_ptr_access<rengine::WorkQueue::Job,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<rengine::WorkQueue::Job,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
      if (((peVar4->m_completed ^ 0xffU) & 1) == 0) {
        __assert_fail("!job->m_completed",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/workqueue.h"
                      ,0x9f,"void rengine::WorkQueue::run()");
      }
      peVar4 = std::
               __shared_ptr_access<rengine::WorkQueue::Job,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<rengine::WorkQueue::Job,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
      (*peVar4->_vptr_Job[2])();
      peVar4 = std::
               __shared_ptr_access<rengine::WorkQueue::Job,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<rengine::WorkQueue::Job,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
      std::mutex::lock(&peVar4->m_mutex);
      peVar4 = std::
               __shared_ptr_access<rengine::WorkQueue::Job,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<rengine::WorkQueue::Job,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
      peVar4->m_completed = true;
      std::__shared_ptr_access<rengine::WorkQueue::Job,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<rengine::WorkQueue::Job,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_38);
      std::condition_variable::notify_one();
      peVar4 = std::
               __shared_ptr_access<rengine::WorkQueue::Job,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<rengine::WorkQueue::Job,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
      std::mutex::unlock(&peVar4->m_mutex);
    }
    std::shared_ptr<rengine::WorkQueue::Job>::~shared_ptr
              ((shared_ptr<rengine::WorkQueue::Job> *)local_38);
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)
               &job.super___shared_ptr<rengine::WorkQueue::Job,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  } while( true );
}

Assistant:

inline void WorkQueue::run()
{
    bool running = m_running;
    while (running) {
        std::unique_lock<std::mutex> locker(m_mutex);
        if (m_jobs.empty()) {
            m_condition.wait(locker);
        }
        std::shared_ptr<Job> job;
        if (!m_jobs.empty()) {
            job = m_jobs.front();
            m_jobs.pop_front();
        }

        // While still holding the mutex, check if we should abort..
        running = m_running;
        locker.unlock();

        // Then, if we're still running, execute the job, mark it completed
        // and then the signal potential waiter.
        if (running && job.get() != nullptr) {
            assert(!job->m_completed);
            job->onExecute();
            job->m_mutex.lock();
            job->m_completed = true;
            job->m_condition.notify_one();
            job->m_mutex.unlock();
        }
    }
}